

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

SearchStatus __thiscall tsbp::LeftmostActiveOnly::SolveParallelTaskflow(LeftmostActiveOnly *this)

{
  undefined8 *puVar1;
  _func_int *p_Var2;
  SearchStatus SVar3;
  LeftmostActiveOnly *pLVar4;
  int iVar5;
  int iVar6;
  pthread_mutex_t *__mutex;
  long lVar7;
  _func_int **__s;
  long lVar8;
  long *plVar9;
  undefined8 uVar10;
  _func_int *p_Var11;
  ulong uVar12;
  Executor *this_00;
  char *pcVar13;
  Node *retval;
  int *piVar14;
  _State_baseV2 *p_Var15;
  pthread_mutex_t *ppVar16;
  atomic<bool> feasibleSolutionCancellationToken;
  SearchStatus status;
  atomic<unsigned_long> exploredNodes;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  endLast;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  begin;
  atomic<unsigned_long> exploredSubtrees;
  Future<void> fu;
  mutex mutex;
  Packing2D solution;
  Taskflow taskflow;
  Executor executor;
  byte local_611;
  SearchStatus local_610;
  anon_class_1_0_00000001 local_609;
  LeftmostActiveOnly *local_608;
  undefined8 local_600;
  long local_5f8;
  long local_5f0;
  int *local_5e8;
  int *local_5e0;
  long local_5d8;
  vector<tf::Node*,std::allocator<tf::Node*>> *local_5d0;
  undefined8 local_5c8;
  anon_class_8_1_69701ed9 local_5c0;
  Future<void> local_5b8;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  Packing2D local_568;
  undefined1 local_4c8 [80];
  pointer local_478;
  pointer ppNStack_470;
  pointer local_468;
  _Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
  _Stack_460;
  bool local_408;
  Executor local_400;
  
  local_5f8 = std::chrono::_V2::steady_clock::now();
  local_5f0 = local_5f8;
  tf::Executor::Executor(&local_400,(long)(this->parameters).LMAOThreads);
  local_4c8._0_8_ = &local_478;
  local_4c8._8_8_ = 0;
  local_4c8._16_8_ = 0;
  local_4c8._24_8_ = 0;
  local_4c8._32_8_ = (__pthread_internal_list *)0x0;
  local_4c8._40_8_ = (__pthread_internal_list *)0x0;
  local_4c8._48_8_ = local_4c8 + 0x40;
  local_4c8._56_8_ = 0;
  local_4c8[0x40] = '\0';
  local_478 = (pointer)0x0;
  ppNStack_470 = (pointer)0x0;
  local_468 = (pointer)0x0;
  _Stack_460._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  _Stack_460._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_460._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  _Stack_460._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_460._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_460._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_460._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_460._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_460._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_460._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map(&_Stack_460,0);
  local_408 = false;
  local_610 = None;
  local_5c8 = 0;
  local_600 = 0;
  local_611 = 0;
  memset(&local_568,0,0x88);
  local_568.ReducedItemInfeasiblePlacementPoints._0_2_ = 0xffff;
  local_568.ReducedItemInfeasiblePlacementPoints._2_6_ = 0xffffffffffff;
  local_568.IsReducedItemPlaced = false;
  local_568.IsFixedItemPlaced = false;
  local_570 = 0;
  local_580 = 0;
  uStack_578 = 0;
  local_590 = 0;
  uStack_588 = 0;
  piVar14 = (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_5e8 = (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_608 = this;
  if (piVar14 != local_5e8) {
    do {
      local_5d8 = (long)*piVar14;
      local_5d0 = (vector<tf::Node*,std::allocator<tf::Node*>> *)local_4c8._0_8_;
      __mutex = (pthread_mutex_t *)
                tf::ObjectPool<tf::Node,_65536UL>::_this_heap
                          ((ObjectPool<tf::Node,_65536UL> *)tf::node_pool);
      iVar5 = pthread_mutex_lock(__mutex);
      if (iVar5 != 0) {
LAB_00146066:
        std::__throw_system_error(iVar5);
      }
      ppVar16 = __mutex + 1;
      uVar12 = 3;
      do {
        iVar5 = (int)uVar12;
        lVar8 = *(long *)((long)__mutex + uVar12 * 0x10 + 0x30);
        if (lVar8 != (long)ppVar16 + uVar12 * 0x10) {
          __s = (_func_int **)(lVar8 + -8);
          goto LAB_00145b12;
        }
        uVar12 = (ulong)(iVar5 - 1);
      } while (iVar5 != 0);
      iVar5 = -1;
      __s = (_func_int **)0x0;
LAB_00145b12:
      local_5e0 = piVar14;
      if (iVar5 == -1) {
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)(tf::node_pool + 8));
        uVar10 = tf::node_pool._56_8_;
        if (iVar5 != 0) goto LAB_00146066;
        if (tf::node_pool._56_8_ == 0x181ba0) {
          pthread_mutex_unlock((pthread_mutex_t *)(tf::node_pool + 8));
          __s = (_func_int **)operator_new(0x10030);
          iVar5 = 0;
          memset(__s,0,0x10030);
          LOCK();
          *__s = (_func_int *)__mutex;
          UNLOCK();
          __s[3] = (_func_int *)0x0;
          __s[4] = (_func_int *)0x0;
          __s[5] = (_func_int *)0x0;
          p_Var11 = *(_func_int **)((long)__mutex + 0x30);
          *(_func_int ***)p_Var11 = __s + 1;
          __s[2] = p_Var11;
          __s[1] = (_func_int *)ppVar16;
          *(_func_int ***)((long)__mutex + 0x30) = __s + 1;
        }
        else {
          if ((0x119 < *(ulong *)(tf::node_pool._56_8_ + 0x18)) ||
             (__s = (_func_int **)(tf::node_pool._56_8_ + -8), *__s != (_func_int *)0x0)) {
            __assert_fail("s->u < M && s->heap == nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/taskflow/taskflow/core/../utility/object_pool.hpp"
                          ,0x261,
                          "T *tf::ObjectPool<tf::Node>::animate(ArgsT &&...) [T = tf::Node, S = 65536, ArgsT = <std::in_place_type_t<tf::Node::Static>, (lambda at /workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/tsbp/src/BranchAndBound.cpp:355:13)>]"
                         );
          }
          uVar12 = *(long *)(tf::node_pool._56_8_ + 0x18) + 1;
          iVar5 = (int)(uVar12 / 0x47);
          if (uVar12 == 0x11a) {
            iVar5 = 4;
          }
          lVar7 = (long)iVar5 * 0x10;
          lVar8 = *(long *)tf::node_pool._56_8_;
          plVar9 = *(long **)(tf::node_pool._56_8_ + 8);
          *plVar9 = lVar8;
          *(long **)(lVar8 + 8) = plVar9;
          puVar1 = *(undefined8 **)((long)__mutex + lVar7 + 0x30);
          *puVar1 = uVar10;
          *(undefined8 **)(uVar10 + 8) = puVar1;
          *(long *)uVar10 = (long)ppVar16 + lVar7;
          *(undefined8 *)((long)__mutex + lVar7 + 0x30) = uVar10;
          LOCK();
          *(pthread_mutex_t **)(uVar10 + -8) = __mutex;
          UNLOCK();
          pthread_mutex_unlock((pthread_mutex_t *)(tf::node_pool + 8));
          __mutex[3].__align = __mutex[3].__align + *(long *)(uVar10 + 0x18);
        }
        *(long *)((long)__mutex + 0x80) = *(long *)((long)__mutex + 0x80) + 0x11a;
      }
      __mutex[3].__align = __mutex[3].__align + 1;
      p_Var15 = (_State_baseV2 *)__s[5];
      p_Var11 = __s[4] + 1;
      __s[4] = p_Var11;
      if (p_Var15 == (_State_baseV2 *)0x0) {
        p_Var2 = __s[3];
        __s[3] = p_Var2 + 1;
        p_Var15 = (_State_baseV2 *)(__s + (long)p_Var2 * 0x1d + 6);
      }
      else {
        __s[5] = (_func_int *)p_Var15->_vptr__State_baseV2;
      }
      iVar6 = (int)((ulong)p_Var11 / 0x47);
      if (p_Var11 == (_func_int *)0x11a) {
        iVar6 = 4;
      }
      if (iVar5 != iVar6) {
        lVar8 = (long)iVar6 * 0x10;
        p_Var11 = __s[1];
        p_Var2 = __s[2];
        *(_func_int **)p_Var2 = p_Var11;
        *(_func_int **)(p_Var11 + 8) = p_Var2;
        p_Var11 = *(_func_int **)((long)__mutex + lVar8 + 0x30);
        *(_func_int ***)p_Var11 = __s + 1;
        __s[2] = p_Var11;
        __s[1] = (_func_int *)((long)ppVar16 + lVar8);
        *(_func_int ***)((long)__mutex + lVar8 + 0x30) = __s + 1;
      }
      pthread_mutex_unlock(__mutex);
      (p_Var15->_M_result)._M_t.
      super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
      .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
           (_Result_base *)&p_Var15->_M_once;
      *(undefined8 *)&(p_Var15->_M_status)._M_data = 0;
      *(undefined1 *)&(p_Var15->_M_once)._M_once = 0;
      p_Var15[1]._M_result._M_t.
      super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
      .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> =
           (_Head_base<0UL,_std::__future_base::_Result_base_*,_false>)0x0;
      p_Var15[1]._M_status = (atomic<unsigned_int>)0x0;
      p_Var15[1]._M_retrieved = (__atomic_flag_base)0x0;
      *(undefined3 *)&p_Var15[1].field_0x15 = 0;
      *(undefined8 *)&p_Var15[1]._M_once = 0;
      p_Var15[2]._vptr__State_baseV2 = (_func_int **)0x0;
      p_Var15[2]._M_result._M_t.
      super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
      .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> =
           (_Head_base<0UL,_std::__future_base::_Result_base_*,_false>)0x0;
      plVar9 = (long *)operator_new(0x50);
      *plVar9 = local_5d8;
      plVar9[1] = (long)local_608;
      plVar9[2] = (long)&local_611;
      plVar9[3] = (long)&local_610;
      plVar9[4] = (long)&local_590;
      plVar9[5] = (long)&local_568;
      plVar9[6] = (long)&local_600;
      plVar9[7] = (long)&local_5c8;
      plVar9[8] = (long)&local_5f8;
      plVar9[9] = (long)&local_5f0;
      *(long **)&p_Var15[1]._M_status = plVar9;
      p_Var15[2]._M_result._M_t.
      super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
      .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> =
           (_Head_base<0UL,_std::__future_base::_Result_base_*,_false>)
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/tsbp/src/BranchAndBound.cpp:355:13)>
           ::_M_invoke;
      p_Var15[2]._vptr__State_baseV2 =
           (_func_int **)
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/tsbp/src/BranchAndBound.cpp:355:13)>
           ::_M_manager;
      *(undefined1 *)
       &p_Var15[3]._M_result._M_t.
        super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
        .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> = 1;
      *(_Ptr_type **)&p_Var15[3]._M_status = &p_Var15[4]._M_result;
      *(_Ptr_type **)&p_Var15[3]._M_once = &p_Var15[4]._M_result;
      p_Var15[4]._vptr__State_baseV2 = (_func_int **)&p_Var15[4]._M_once;
      *(__atomic_futex_unsigned<2147483648U> **)&p_Var15[4]._M_once = &p_Var15[5]._M_status;
      p_Var15[5]._vptr__State_baseV2 = (_func_int **)&p_Var15[5]._M_status;
      p_Var15[5]._M_result._M_t.
      super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
      .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> =
           (_Head_base<0UL,_std::__future_base::_Result_base_*,_false>)(p_Var15 + 6);
      p_Var15[6]._vptr__State_baseV2 = (_func_int **)0x0;
      p_Var15[6]._M_result._M_t.
      super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
      .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> =
           (_Head_base<0UL,_std::__future_base::_Result_base_*,_false>)0x0;
      p_Var15[6]._M_status._M_data.super___atomic_base<unsigned_int>._M_i = 0;
      *(undefined8 *)&p_Var15[6]._M_once = 0;
      p_Var15[7]._vptr__State_baseV2 = (_func_int **)0x0;
      p_Var15->_vptr__State_baseV2 = __s;
      local_5b8.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           p_Var15;
      std::vector<tf::Node*,std::allocator<tf::Node*>>::emplace_back<tf::Node*>
                (local_5d0,(Node **)&local_5b8);
      piVar14 = local_5e0 + 1;
    } while (piVar14 != local_5e8);
  }
  local_5c0.repeat = 1;
  this_00 = &local_400;
  tf::Executor::
  run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
            (&local_5b8,this_00,(Taskflow *)local_4c8,&local_5c0,&local_609);
  if (local_5b8.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_State_baseV2 *)0x0) {
    std::__future_base::_State_baseV2::wait
              (local_5b8.super_future<void>.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,this_00);
    lVar8 = std::chrono::_V2::steady_clock::now();
    pLVar4 = local_608;
    if (local_610 == Abort) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Search was aborted.\n",0x14);
    }
    else {
      if ((local_611 & 1) == 0) {
        local_610 = Infeasible;
        lVar7 = 0x17;
        pcVar13 = "Problem is infeasible.\n";
      }
      else {
        local_610 = Feasible;
        (local_608->solution).MaxX = local_568.MaxX;
        (local_608->solution).AbscissaMaxX = local_568.AbscissaMaxX;
        (local_608->solution).ActiveX = local_568.ActiveX;
        (local_608->solution).ActiveY = local_568.ActiveY;
        (local_608->solution).MinX = local_568.MinX;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&(local_608->solution).PlacedItems.m_bits,&local_568.PlacedItems.m_bits);
        (pLVar4->solution).PlacedItems.m_num_bits = local_568.PlacedItems.m_num_bits;
        std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator=
                  ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
                   &(pLVar4->solution).Items,
                   (vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)&local_568.Items);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&(pLVar4->solution).PlacedAreaVector,&local_568.PlacedAreaVector);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&(pLVar4->solution).DeactivatedAreaVector,&local_568.DeactivatedAreaVector);
        *(ulong *)((long)&(pLVar4->solution).RemainingItemAreaToPlace + 2) =
             CONCAT26((undefined2)local_568.ReducedItemInfeasiblePlacementPoints,
                      local_568.RemainingItemAreaToPlace._2_6_);
        *(ulong *)((long)&(pLVar4->solution).ReducedItemInfeasiblePlacementPoints + 2) =
             CONCAT26(local_568._152_2_,local_568.ReducedItemInfeasiblePlacementPoints._2_6_);
        (pLVar4->solution).DeactivatedArea = local_568.DeactivatedArea;
        (pLVar4->solution).RemainingItemAreaToPlace =
             (double)CONCAT62(local_568.RemainingItemAreaToPlace._2_6_,
                              local_568.RemainingItemAreaToPlace._0_2_);
        lVar7 = 0x19;
        pcVar13 = "Feasible solution found.\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,lVar7);
      (pLVar4->statistics).NodeCount = (int)local_600;
      (pLVar4->statistics).TimeMemoryDeallocation = (double)((lVar8 - local_5f8) / 1000000);
    }
    SVar3 = local_610;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>_&>
      ::_S_vtable._M_arr
      [local_5b8._handle.
       super__Variant_base<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
       .
       super__Move_assign_alias<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
       .
       super__Copy_assign_alias<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
       .
       super__Move_ctor_alias<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
       .
       super__Copy_ctor_alias<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
       .
       super__Variant_storage_alias<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
       ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_5c0,&local_5b8._handle);
    local_5b8._handle.
    super__Variant_base<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
    .
    super__Move_assign_alias<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
    .
    super__Copy_assign_alias<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
    .
    super__Move_ctor_alias<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
    .
    super__Copy_ctor_alias<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
    .
    super__Variant_storage_alias<std::monostate,_std::weak_ptr<tf::Topology>,_std::weak_ptr<tf::AsyncTopology>_>
    ._M_index = 0xff;
    if (local_5b8.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_5b8.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Packing2D::~Packing2D(&local_568);
    tf::Taskflow::~Taskflow((Taskflow *)local_4c8);
    tf::Executor::~Executor(&local_400);
    return SVar3;
  }
  uVar10 = std::__throw_future_error(3);
  __clang_call_terminate(uVar10);
}

Assistant:

SearchStatus LeftmostActiveOnly::SolveParallelTaskflow()
{
    std::atomic<std::chrono::steady_clock::time_point> begin = std::chrono::steady_clock::now();
    std::atomic<std::chrono::steady_clock::time_point> endLast = begin.load();

    size_t numberOfThreads = this->parameters.LMAOThreads;
    tf::Executor executor(numberOfThreads);
    tf::Taskflow taskflow;

    SearchStatus status = SearchStatus::None;

    std::atomic<size_t> exploredSubtrees(0);
    std::atomic<size_t> exploredNodes(0);
    std::atomic<bool> feasibleSolutionCancellationToken = false;
    Packing2D solution;

    std::mutex mutex;

    for (size_t itemId: this->branchingOrder)
    {
        tf::Task itemSpecificBranch = taskflow.emplace(
            [&, itemId]()
            {
                    // TODO.Performance: write copy assignment constructor for Node to run the preprocess only once. It has its copy assignment constructor disabled because it has a unique_ptr member.
                    ////LeftmostActiveOnly lmaoSubtree = *this;
                    LeftmostActiveOnly lmao(this->parameters);
                    lmao.AddContainer(container);
                    lmao.AddItems(items, itemId, this->fixedItemCoordinatesX);
                    lmao.SetBranchingOrder(this->branchingOrder);
                    lmao.AddCancellationToken(&feasibleSolutionCancellationToken);

                    SearchStatus localStatus = lmao.SolveSequential();
                    if (localStatus == SearchStatus::Abort)
                    {
                        status = localStatus;
                    }

                    if (localStatus == SearchStatus::Feasible)
                    {
                        mutex.lock();
                        solution = lmao.GetSolution();
                        mutex.unlock();
                    }

                    exploredNodes += lmao.GetTreeSize();
                    exploredSubtrees++;

                    std::chrono::steady_clock::time_point end = std::chrono::steady_clock::now();
                    endLast = end;

                    ////if (this->parameters.LMAOEnableLogging)
                    if (false)
                    {
                        std::cout << "LMAO \t Explored subtrees = " + std::to_string(exploredSubtrees) + " / " + std::to_string(items.size()) + "\n";

                        std::cout << "Elapsed time = " << std::chrono::duration_cast<std::chrono::seconds>(end - begin.load()).count() << "s\n";
                    } });
    }

    // TODO.Performance: Consider prioritizing the reduced domain item and smaller items. It takes the longest to compute and should not come late in the process, s.t. the other threads cannot be used as no computations are left.
    // TODO.Performance: Execution with the taskflow library takes longer in sequential and parallel mode.
    // In sequential mode, the issue seems to be that a task/thread is blocked unitl after it has finished computation *and* until its memory fully deallocated.
    // This also has an impact in parallel mode.
    // Look into async tasks https://taskflow.github.io/taskflow/AsyncTasking.html and parallel algorithms.

    tf::Future<void> fu = executor.run(taskflow);
    fu.wait(); // block until the execution completes

    std::chrono::steady_clock::time_point endTaskflow = std::chrono::steady_clock::now();

    if (status == SearchStatus::Abort)
    {
        std::cout << "Search was aborted.\n";
        return status;
    }

    if (feasibleSolutionCancellationToken.load())
    {
        status = SearchStatus::Feasible;
        this->solution = solution;
        std::cout << "Feasible solution found.\n";
    }
    else
    {
        status = SearchStatus::Infeasible;
        std::cout << "Problem is infeasible.\n";
    }

    ////if (this->parameters.LMAOEnableLogging)
    if (false)
    {
        std::cout << "LMAO \t Total explored nodes = " + std::to_string(exploredNodes.load()) + "\n";
    }

    this->statistics.NodeCount = exploredNodes.load();
    this->statistics.TimeMemoryDeallocation = std::chrono::duration_cast<std::chrono::milliseconds>(endTaskflow - endLast.load()).count();

    return status;
}